

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::Texture::Texture(Texture *this,uint64_t id,Element *element,Document *doc,string *name)

{
  string *psVar1;
  bool bVar2;
  uint uVar3;
  Element *pEVar4;
  Element *pEVar5;
  Token *pTVar6;
  element_type *peVar7;
  ImportSettings *pIVar8;
  uint64_t dest;
  reference ppCVar9;
  Token *t;
  Token *t_00;
  Token *t_01;
  Token *t_02;
  float fVar10;
  float fVar11;
  aiVector3t<float> aVar12;
  Video *local_5a8;
  Video *video;
  string local_368;
  Object *local_348;
  Object *ob;
  Connection *con;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *__range3;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *local_308;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *conns;
  float local_2f8;
  allocator local_2e9;
  string local_2e8;
  undefined8 local_2c4;
  float local_2bc;
  undefined8 *local_2b8;
  aiVector3D *trans;
  float local_2a8;
  allocator local_299;
  string local_298;
  undefined8 local_274;
  float local_26c;
  undefined8 *local_268;
  aiVector3D *scaling;
  undefined1 local_258 [6];
  bool ok;
  shared_ptr<const_Assimp::FBX::PropertyTable> local_238;
  string local_228;
  aiVector2D local_208;
  aiVector2D local_200;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  allocator local_191;
  string local_190;
  Element *local_170;
  Element *Cropping;
  string local_160;
  Element *local_140;
  Element *Texture_Alpha_Source;
  string local_130;
  Element *local_110;
  Element *ModelUVScaling;
  string local_100;
  Element *local_e0;
  Element *ModelUVTranslation;
  string local_d0;
  Element *local_b0;
  Element *RelativeFilename;
  string local_a0;
  Element *local_80;
  Element *FileName;
  string local_70;
  Element *local_50;
  Element *Type;
  Scope *sc;
  string *local_30;
  string *name_local;
  Document *doc_local;
  Element *element_local;
  uint64_t id_local;
  Texture *this_local;
  
  local_30 = name;
  name_local = (string *)doc;
  doc_local = (Document *)element;
  element_local = (Element *)id;
  id_local = (uint64_t)this;
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Texture_0037b790;
  aiVector2t<float>::aiVector2t(&this->uvTrans);
  aiVector2t<float>::aiVector2t(&this->uvScaling,1.0,1.0);
  std::__cxx11::string::string((string *)&this->type);
  std::__cxx11::string::string((string *)&this->relativeFileName);
  std::__cxx11::string::string((string *)&this->fileName);
  std::__cxx11::string::string((string *)&this->alphaSource);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::shared_ptr(&this->props);
  this->media = (Video *)0x0;
  pEVar4 = (Element *)GetRequiredScope((Element *)doc_local);
  Type = pEVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"Type",(allocator *)((long)&FileName + 7));
  pEVar5 = Scope::operator[]((Scope *)pEVar4,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&FileName + 7));
  pEVar4 = Type;
  local_50 = pEVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"FileName",(allocator *)((long)&RelativeFilename + 7));
  pEVar5 = Scope::operator[]((Scope *)pEVar4,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&RelativeFilename + 7));
  pEVar4 = Type;
  local_80 = pEVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,"RelativeFilename",(allocator *)((long)&ModelUVTranslation + 7));
  pEVar5 = Scope::operator[]((Scope *)pEVar4,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ModelUVTranslation + 7));
  pEVar4 = Type;
  local_b0 = pEVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_100,"ModelUVTranslation",(allocator *)((long)&ModelUVScaling + 7));
  pEVar5 = Scope::operator[]((Scope *)pEVar4,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ModelUVScaling + 7));
  pEVar4 = Type;
  local_e0 = pEVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_130,"ModelUVScaling",(allocator *)((long)&Texture_Alpha_Source + 7));
  pEVar5 = Scope::operator[]((Scope *)pEVar4,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Texture_Alpha_Source + 7));
  pEVar4 = Type;
  local_110 = pEVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_160,"Texture_Alpha_Source",(allocator *)((long)&Cropping + 7));
  pEVar5 = Scope::operator[]((Scope *)pEVar4,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Cropping + 7));
  pEVar4 = Type;
  local_140 = pEVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"Cropping",&local_191);
  pEVar4 = Scope::operator[]((Scope *)pEVar4,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  local_170 = pEVar4;
  if (local_50 != (Element *)0x0) {
    pTVar6 = GetRequiredToken(local_50,0);
    ParseTokenAsString_abi_cxx11_(&local_1b8,(FBX *)pTVar6,t);
    std::__cxx11::string::operator=((string *)&this->type,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
  }
  if (local_80 != (Element *)0x0) {
    pTVar6 = GetRequiredToken(local_80,0);
    ParseTokenAsString_abi_cxx11_(&local_1d8,(FBX *)pTVar6,t_00);
    std::__cxx11::string::operator=((string *)&this->fileName,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  if (local_b0 != (Element *)0x0) {
    pTVar6 = GetRequiredToken(local_b0,0);
    ParseTokenAsString_abi_cxx11_(&local_1f8,(FBX *)pTVar6,t_01);
    std::__cxx11::string::operator=((string *)&this->relativeFileName,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  if (local_e0 != (Element *)0x0) {
    pTVar6 = GetRequiredToken(local_e0,0);
    fVar10 = ParseTokenAsFloat(pTVar6);
    pTVar6 = GetRequiredToken(local_e0,1);
    fVar11 = ParseTokenAsFloat(pTVar6);
    aiVector2t<float>::aiVector2t(&local_200,fVar10,fVar11);
    this->uvTrans = local_200;
  }
  if (local_110 != (Element *)0x0) {
    pTVar6 = GetRequiredToken(local_110,0);
    fVar10 = ParseTokenAsFloat(pTVar6);
    pTVar6 = GetRequiredToken(local_110,1);
    fVar11 = ParseTokenAsFloat(pTVar6);
    aiVector2t<float>::aiVector2t(&local_208,fVar10,fVar11);
    this->uvScaling = local_208;
  }
  if (local_170 == (Element *)0x0) {
    this->crop[3] = 0;
    this->crop[2] = 0;
    this->crop[1] = 0;
    this->crop[0] = 0;
  }
  else {
    pTVar6 = GetRequiredToken(local_170,0);
    uVar3 = ParseTokenAsInt(pTVar6);
    this->crop[0] = uVar3;
    pTVar6 = GetRequiredToken(local_170,1);
    uVar3 = ParseTokenAsInt(pTVar6);
    this->crop[1] = uVar3;
    pTVar6 = GetRequiredToken(local_170,2);
    uVar3 = ParseTokenAsInt(pTVar6);
    this->crop[2] = uVar3;
    pTVar6 = GetRequiredToken(local_170,3);
    uVar3 = ParseTokenAsInt(pTVar6);
    this->crop[3] = uVar3;
  }
  if (local_140 != (Element *)0x0) {
    pTVar6 = GetRequiredToken(local_140,0);
    ParseTokenAsString_abi_cxx11_(&local_228,(FBX *)pTVar6,t_02);
    std::__cxx11::string::operator=((string *)&this->alphaSource,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
  }
  psVar1 = name_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_258,"Texture.FbxFileTexture",(allocator *)((long)&scaling + 7));
  Util::GetPropertyTable
            ((Util *)&local_238,(Document *)psVar1,(string *)local_258,(Element *)doc_local,
             (Scope *)Type,false);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::operator=(&this->props,&local_238);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr(&local_238);
  std::__cxx11::string::~string((string *)local_258);
  std::allocator<char>::~allocator((allocator<char> *)((long)&scaling + 7));
  peVar7 = std::
           __shared_ptr_access<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->props);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_298,"Scaling",&local_299);
  aVar12 = PropertyGet<aiVector3t<float>>(peVar7,&local_298,(bool *)((long)&scaling + 6),false);
  local_2a8 = aVar12.z;
  trans = aVar12._0_8_;
  local_274 = trans;
  local_26c = local_2a8;
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  local_268 = &local_274;
  if ((scaling._6_1_ & 1) != 0) {
    (this->uvScaling).x = (float)local_274;
    (this->uvScaling).y = local_274._4_4_;
  }
  peVar7 = std::
           __shared_ptr_access<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->props);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e8,"Translation",&local_2e9);
  aVar12 = PropertyGet<aiVector3t<float>>(peVar7,&local_2e8,(bool *)((long)&scaling + 6),false);
  local_2f8 = aVar12.z;
  conns = aVar12._0_8_;
  local_2c4 = conns;
  local_2bc = local_2f8;
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  local_2b8 = &local_2c4;
  if ((scaling._6_1_ & 1) != 0) {
    (this->uvTrans).x = (float)local_2c4;
    (this->uvTrans).y = local_2c4._4_4_;
  }
  pIVar8 = Document::Settings((Document *)name_local);
  psVar1 = name_local;
  if ((pIVar8->readTextures & 1U) != 0) {
    dest = Object::ID(&this->super_Object);
    Document::GetConnectionsByDestinationSequenced
              ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                *)&__range3,(Document *)psVar1,dest);
    local_308 = (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                 *)&__range3;
    __end3 = std::
             vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
             ::begin((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                      *)&__range3);
    con = (Connection *)
          std::
          vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
          ::end((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                 *)&__range3);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                                       *)&con), bVar2) {
      ppCVar9 = __gnu_cxx::
                __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                ::operator*(&__end3);
      ob = (Object *)*ppCVar9;
      local_348 = Connection::SourceObject((Connection *)ob);
      if (local_348 == (Object *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_368,"failed to read source object for texture link, ignoring",
                   (allocator *)((long)&video + 7));
        Util::DOMWarning(&local_368,(Element *)doc_local);
        std::__cxx11::string::~string((string *)&local_368);
        std::allocator<char>::~allocator((allocator<char> *)((long)&video + 7));
      }
      else {
        if (local_348 == (Object *)0x0) {
          local_5a8 = (Video *)0x0;
        }
        else {
          local_5a8 = (Video *)__dynamic_cast(local_348,&Object::typeinfo,&Video::typeinfo,0);
        }
        if (local_5a8 != (Video *)0x0) {
          this->media = local_5a8;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
      ::operator++(&__end3);
    }
    std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
    ~vector((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
             *)&__range3);
  }
  return;
}

Assistant:

Texture::Texture(uint64_t id, const Element& element, const Document& doc, const std::string& name)
: Object(id,element,name)
, uvScaling(1.0f,1.0f)
, media(0)
{
    const Scope& sc = GetRequiredScope(element);

    const Element* const Type = sc["Type"];
    const Element* const FileName = sc["FileName"];
    const Element* const RelativeFilename = sc["RelativeFilename"];
    const Element* const ModelUVTranslation = sc["ModelUVTranslation"];
    const Element* const ModelUVScaling = sc["ModelUVScaling"];
    const Element* const Texture_Alpha_Source = sc["Texture_Alpha_Source"];
    const Element* const Cropping = sc["Cropping"];

    if(Type) {
        type = ParseTokenAsString(GetRequiredToken(*Type,0));
    }

    if(FileName) {
        fileName = ParseTokenAsString(GetRequiredToken(*FileName,0));
    }

    if(RelativeFilename) {
        relativeFileName = ParseTokenAsString(GetRequiredToken(*RelativeFilename,0));
    }

    if(ModelUVTranslation) {
        uvTrans = aiVector2D(ParseTokenAsFloat(GetRequiredToken(*ModelUVTranslation,0)),
            ParseTokenAsFloat(GetRequiredToken(*ModelUVTranslation,1))
        );
    }

    if(ModelUVScaling) {
        uvScaling = aiVector2D(ParseTokenAsFloat(GetRequiredToken(*ModelUVScaling,0)),
            ParseTokenAsFloat(GetRequiredToken(*ModelUVScaling,1))
        );
    }

    if(Cropping) {
        crop[0] = ParseTokenAsInt(GetRequiredToken(*Cropping,0));
        crop[1] = ParseTokenAsInt(GetRequiredToken(*Cropping,1));
        crop[2] = ParseTokenAsInt(GetRequiredToken(*Cropping,2));
        crop[3] = ParseTokenAsInt(GetRequiredToken(*Cropping,3));
    }
    else {
        // vc8 doesn't support the crop() syntax in initialization lists
        // (and vc9 WARNS about the new (i.e. compliant) behaviour).
        crop[0] = crop[1] = crop[2] = crop[3] = 0;
    }

    if(Texture_Alpha_Source) {
        alphaSource = ParseTokenAsString(GetRequiredToken(*Texture_Alpha_Source,0));
    }

    props = GetPropertyTable(doc,"Texture.FbxFileTexture",element,sc);

    // 3DS Max and FBX SDK use "Scaling" and "Translation" instead of "ModelUVScaling" and "ModelUVTranslation". Use these properties if available.
    bool ok;
    const aiVector3D& scaling = PropertyGet<aiVector3D>(*props, "Scaling", ok);
    if (ok) {
        uvScaling.x = scaling.x;
        uvScaling.y = scaling.y;
    }

    const aiVector3D& trans = PropertyGet<aiVector3D>(*props, "Translation", ok);
    if (ok) {
        uvTrans.x = trans.x;
        uvTrans.y = trans.y;
    }

    // resolve video links
    if(doc.Settings().readTextures) {
        const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID());
        for(const Connection* con : conns) {
            const Object* const ob = con->SourceObject();
            if(!ob) {
                DOMWarning("failed to read source object for texture link, ignoring",&element);
                continue;
            }

            const Video* const video = dynamic_cast<const Video*>(ob);
            if(video) {
                media = video;
            }
        }
    }
}